

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardware.cpp
# Opt level: O0

DFrameBuffer * I_SetMode(int *width,int *height,DFrameBuffer *old)

{
  int iVar1;
  undefined4 extraout_var;
  DFrameBuffer *res;
  bool fs;
  DFrameBuffer *old_local;
  int *height_local;
  int *width_local;
  
  res._7_1_ = false;
  iVar1 = (*Video->_vptr_IVideo[2])();
  if (iVar1 == 0) {
    res._7_1_ = false;
  }
  else if (iVar1 == 1) {
    res._7_1_ = true;
  }
  else if (iVar1 == 2) {
    res._7_1_ = FBoolCVar::operator_cast_to_bool(&fullscreen);
  }
  iVar1 = (*Video->_vptr_IVideo[4])
                    (Video,(ulong)(uint)*width,(ulong)(uint)*height,(ulong)res._7_1_,old);
  return (DFrameBuffer *)CONCAT44(extraout_var,iVar1);
}

Assistant:

DFrameBuffer *I_SetMode (int &width, int &height, DFrameBuffer *old)
{
	bool fs = false;
	switch (Video->GetDisplayType ())
	{
	case DISPLAY_WindowOnly:
		fs = false;
		break;
	case DISPLAY_FullscreenOnly:
		fs = true;
		break;
	case DISPLAY_Both:
		fs = fullscreen;
		break;
	}
	DFrameBuffer *res = Video->CreateFrameBuffer (width, height, fs, old);

	/* Right now, CreateFrameBuffer cannot return NULL
	if (res == NULL)
	{
		I_FatalError ("Mode %dx%d is unavailable\n", width, height);
	}
	*/
	return res;
}